

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

errr finish_parse_object_property(parser *p)

{
  undefined8 *puVar1;
  angband_constants *paVar2;
  undefined8 *puVar3;
  uint16_t uVar4;
  long lVar5;
  ulong uVar6;
  
  z_info->property_max = 0;
  puVar3 = (undefined8 *)parser_priv(p);
  paVar2 = z_info;
  uVar4 = z_info->property_max;
  for (; puVar3 != (undefined8 *)0x0; puVar3 = (undefined8 *)*puVar3) {
    uVar4 = uVar4 + 1;
    paVar2->property_max = uVar4;
  }
  obj_properties = (obj_property *)mem_zalloc((ulong)uVar4 * 0xd8 + 0xd8);
  uVar6 = (ulong)z_info->property_max;
  puVar3 = (undefined8 *)parser_priv(p);
  lVar5 = uVar6 * 0xd8;
  while( true ) {
    if (puVar3 == (undefined8 *)0x0) {
      z_info->property_max = z_info->property_max + 1;
      parser_destroy(p);
      return 0;
    }
    if ((long)uVar6 < 1) break;
    memcpy((void *)((long)obj_properties->type_mult + lVar5 + -0x20),puVar3,0xd8);
    puVar1 = (undefined8 *)*puVar3;
    mem_free(puVar3);
    uVar6 = uVar6 - 1;
    lVar5 = lVar5 + -0xd8;
    puVar3 = puVar1;
  }
  __assert_fail("idx > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                ,0xd75,"errr finish_parse_object_property(struct parser *)");
}

Assistant:

static errr finish_parse_object_property(struct parser *p) {
	struct obj_property *prop, *n;
	int idx;

	/* Scan the list for the max id */
	z_info->property_max = 0;
	prop = parser_priv(p);
	while (prop) {
		z_info->property_max++;
		prop = prop->next;
	}

	/* Allocate the direct access list and copy the data to it */
	obj_properties = mem_zalloc((z_info->property_max + 1) * sizeof(*prop));
	idx = z_info->property_max;
	for (prop = parser_priv(p); prop; prop = n, idx--) {
		assert(idx > 0);

		memcpy(&obj_properties[idx], prop, sizeof(*prop));
		n = prop->next;

		mem_free(prop);
	}
	z_info->property_max += 1;

	parser_destroy(p);
	return 0;
}